

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int parseArgs(int argc,char **argv,char **in_file_path_ptr,char **out_file_path_ptr,
             uint *target_driver_ptr,size_t *file_offset_ptr)

{
  char *__nptr;
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char *buffer;
  size_t buffer_length;
  char *extension;
  char *option_raw_value;
  char *option_name;
  int arg_index;
  size_t *file_offset_ptr_local;
  uint *target_driver_ptr_local;
  char **out_file_path_ptr_local;
  char **in_file_path_ptr_local;
  char **argv_local;
  int argc_local;
  
  option_name._4_4_ = 1;
  while( true ) {
    bVar7 = false;
    if (option_name._4_4_ < argc) {
      bVar7 = *argv[option_name._4_4_] == '-';
    }
    if (!bVar7) break;
    pcVar6 = argv[option_name._4_4_];
    __nptr = argv[option_name._4_4_ + 1];
    iVar1 = strcmp(pcVar6,"-v");
    if (iVar1 == 0) {
      lVar2 = strtol(__nptr,(char **)0x0,10);
      *target_driver_ptr = (uint)lVar2;
    }
    else {
      iVar1 = strcmp(pcVar6,"-o");
      if (iVar1 != 0) {
        fprintf(_stderr,"ERROR: Unrecognized option \"%s\"\n",pcVar6);
        return -1;
      }
      sVar3 = strtol(__nptr,(char **)0x0,0x10);
      *file_offset_ptr = sVar3;
    }
    option_name._4_4_ = option_name._4_4_ + 2;
  }
  if (argc <= option_name._4_4_) {
    fprintf(_stderr,"ERROR: Expected \"in_file_path\" after options\n");
    return -2;
  }
  *in_file_path_ptr = argv[option_name._4_4_];
  if (option_name._4_4_ + 1 < argc) {
    *out_file_path_ptr = argv[option_name._4_4_ + 1];
  }
  else {
    sVar4 = strlen(*in_file_path_ptr);
    sVar5 = strlen(".bin");
    sVar4 = sVar4 + sVar5 + 1;
    pcVar6 = (char *)malloc(sVar4);
    snprintf(pcVar6,sVar4,"%s%s",*in_file_path_ptr,".bin");
    *out_file_path_ptr = pcVar6;
  }
  return 0;
}

Assistant:

int parseArgs(
	int argc, 
	char *argv[], 
	const char ** in_file_path_ptr, 		// memory address for "in_file_path" argument
	const char ** out_file_path_ptr, 		// memory address for "out_file_path" argument
	unsigned int * target_driver_ptr,		// memory address for "target_driver_ptr" argument
	size_t * file_offset_ptr				// memory address for "file_offset_ptr"argument
) {

	int arg_index = 1;		// Tracks index of currently processed argument

	/* Process options (if available) */
	for (; arg_index < argc && argv[arg_index][0] == '-'; arg_index += 2) {
		const char * option_name = argv[arg_index];
		const char * option_raw_value = argv[arg_index+1];

		if (strcmp(option_name, "-v") == 0) {
			*target_driver_ptr = (unsigned int)strtol(option_raw_value, NULL, 10);
		}
		else if (strcmp(option_name, "-o") == 0) {
			*file_offset_ptr = (size_t)strtol(option_raw_value, NULL, 0x10);
		}
		else {
			fprintf(stderr, "ERROR: Unrecognized option \"%s\"\n", option_name);
			return -1;
		}
	}

	/* Process "in_file_path" argument */
	if (arg_index >= argc) {
		fprintf(stderr, "ERROR: Expected \"in_file_path\" after options\n");
		return -2;
	}

	*in_file_path_ptr = argv[arg_index++];

	/* Process "out_file_path" argument */
	if (arg_index >= argc) {
		const char * extension = ".bin";
		const size_t buffer_length = strlen(*in_file_path_ptr) + strlen(extension) + 1;
		char * buffer = malloc(buffer_length);

		snprintf(buffer, buffer_length, "%s%s", *in_file_path_ptr, extension);

		*out_file_path_ptr = (const char*)buffer;
	}
	else {
		*out_file_path_ptr = argv[arg_index++];
	}

	return 0;
}